

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowStackToolWindow(bool *p_open)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  ImGuiStackLevelInfo *text;
  ImGuiStackLevelInfo *pIVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  ImVec2 IVar8;
  ImGuiStackLevelInfo *info;
  int n_1;
  float id_width;
  int n;
  char level_desc [256];
  int stack_n;
  char *p_end;
  char *p;
  float time_since_copy;
  ImGuiID active_id;
  ImGuiID hovered_id;
  ImGuiStackTool *tool;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000274;
  bool *in_stack_00000278;
  char *in_stack_00000280;
  ImGuiID IVar9;
  undefined1 in_stack_fffffffffffffe7c;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  ImVec2 *in_stack_fffffffffffffe80;
  ImGuiTableFlags in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int i;
  char *in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  float in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb3;
  ImGuiID in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffeb8;
  ImGuiTableColumnFlags in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  int local_54;
  bool *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  ImVec4 local_3c;
  float local_2c;
  uint local_28;
  uint local_24;
  ImGuiStackTool *local_20;
  ImVec2 local_18;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  if (((GImGui->NextWindowData).Flags & 2U) == 0) {
    fVar7 = GetFontSize();
    ImVec2::ImVec2(&local_18,0.0,fVar7 * 8.0);
    SetNextWindowSize(&local_18,4);
  }
  bVar1 = Begin(in_stack_00000280,in_stack_00000278,in_stack_00000274);
  if ((bVar1) && (pIVar2 = GetCurrentWindow(), pIVar2->BeginCount < 2)) {
    local_20 = &local_10->DebugStackTool;
    local_24 = local_10->HoveredIdPreviousFrame;
    local_28 = local_10->ActiveId;
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)local_24,(ulong)local_28);
    SameLine(0.0,-1.0);
    MetricsHelpMarker((char *)0x4b2689);
    local_2c = (float)local_10->Time - local_20->CopyToClipboardLastTime;
    Checkbox(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    SameLine(0.0,-1.0);
    if (((local_2c < 0.0) || (0.75 <= local_2c)) || (fVar7 = fmodf(local_2c,0.25), 0.125 <= fVar7))
    {
      ImVec4::ImVec4(&local_3c);
    }
    else {
      ImVec4::ImVec4(&local_3c,1.0,1.0,0.3,1.0);
    }
    TextColored(&local_3c,"*COPIED*");
    if ((((local_20->CopyToClipboardOnCtrlC & 1U) != 0) &&
        (bVar1 = IsKeyDown(ImGuiKey_KeysData_OFFSET), bVar1)) &&
       (bVar1 = IsKeyPressed(ImGuiKey_KeysData_OFFSET,false), bVar1)) {
      local_20->CopyToClipboardLastTime = (float)local_10->Time;
      pcVar6 = (local_10->TempBuffer).Data;
      pcVar3 = pcVar6 + (local_10->TempBuffer).Size;
      for (local_54 = 0; bVar1 = local_54 < (local_20->Results).Size,
          in_stack_fffffffffffffe7f = bVar1 && pcVar6 + 3 < pcVar3, bVar1 && pcVar6 + 3 < pcVar3;
          local_54 = local_54 + 1) {
        pcVar5 = pcVar6 + 1;
        *pcVar6 = '/';
        StackToolFormatLevelInfo
                  ((ImGuiStackTool *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb4,(bool)in_stack_fffffffffffffeb3,
                   in_stack_fffffffffffffea8,
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        in_stack_fffffffffffffea4 = 0;
        while (in_stack_fffffffffffffe7e =
                    (&stack0xfffffffffffffea8)[in_stack_fffffffffffffea4] != '\0' &&
                    pcVar5 + 2 < pcVar3,
              (&stack0xfffffffffffffea8)[in_stack_fffffffffffffea4] != '\0' && pcVar5 + 2 < pcVar3)
        {
          pcVar6 = pcVar5;
          if ((&stack0xfffffffffffffea8)[in_stack_fffffffffffffea4] == '/') {
            pcVar6 = pcVar5 + 1;
            *pcVar5 = '\\';
          }
          *pcVar6 = (&stack0xfffffffffffffea8)[in_stack_fffffffffffffea4];
          in_stack_fffffffffffffea4 = in_stack_fffffffffffffea4 + 1;
          pcVar5 = pcVar6 + 1;
        }
        pcVar6 = pcVar5;
      }
      *pcVar6 = '\0';
      SetClipboardText((char *)in_stack_fffffffffffffe80);
    }
    local_20->LastActiveFrame = local_10->FrameCount;
    uVar10 = false;
    if (0 < (local_20->Results).Size) {
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe9c,0.0,0.0);
      uVar10 = BeginTable(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                          in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                          (float)CONCAT13(in_stack_fffffffffffffe7f,
                                          CONCAT12(in_stack_fffffffffffffe7e,
                                                   CONCAT11(uVar10,in_stack_fffffffffffffe7c))));
    }
    if ((bool)uVar10 != false) {
      IVar8 = CalcTextSize(in_stack_fffffffffffffea8,
                           (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0),
                           in_stack_fffffffffffffe98);
      TableSetupColumn(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                       ,in_stack_fffffffffffffeb4);
      TableSetupColumn(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                       ,in_stack_fffffffffffffeb4);
      TableSetupColumn(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                       ,in_stack_fffffffffffffeb4);
      TableHeadersRow();
      for (i = 0; i < (local_20->Results).Size; i = i + 1) {
        text = ImVector<ImGuiStackLevelInfo>::operator[](&local_20->Results,i);
        TableNextColumn();
        if (i < 1) {
          IVar9 = 0;
        }
        else {
          pIVar4 = ImVector<ImGuiStackLevelInfo>::operator[](&local_20->Results,i + -1);
          IVar9 = pIVar4->ID;
        }
        Text("0x%08X",(ulong)IVar9);
        TableNextColumn();
        StackToolFormatLevelInfo
                  ((ImGuiStackTool *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb4,(bool)in_stack_fffffffffffffeb3,
                   in_stack_fffffffffffffea8,
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        TextUnformatted((char *)text,
                        (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                         CONCAT16(in_stack_fffffffffffffe7e,
                                                  CONCAT15(uVar10,CONCAT14(in_stack_fffffffffffffe7c
                                                                           ,IVar9)))));
        TableNextColumn();
        Text("0x%08X",(ulong)text->ID);
        if (i == (local_20->Results).Size + -1) {
          GetColorU32((ImGuiCol)IVar8.y,IVar8.x);
          TableSetBgColor(in_stack_fffffffffffffea4,(ImU32)in_stack_fffffffffffffea0,
                          (int)in_stack_fffffffffffffe9c);
        }
      }
      EndTable();
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 8.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiStackTool* tool = &g.DebugStackTool;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // CTRL+C to copy path
    const float time_since_copy = (float)g.Time - tool->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard", &tool->CopyToClipboardOnCtrlC);
    SameLine();
    TextColored((time_since_copy >= 0.0f && time_since_copy < 0.75f && ImFmod(time_since_copy, 0.25f) < 0.25f * 0.5f) ? ImVec4(1.f, 1.f, 0.3f, 1.f) : ImVec4(), "*COPIED*");
    if (tool->CopyToClipboardOnCtrlC && IsKeyDown(ImGuiMod_Ctrl) && IsKeyPressed(ImGuiKey_C))
    {
        tool->CopyToClipboardLastTime = (float)g.Time;
        char* p = g.TempBuffer.Data;
        char* p_end = p + g.TempBuffer.Size;
        for (int stack_n = 0; stack_n < tool->Results.Size && p + 3 < p_end; stack_n++)
        {
            *p++ = '/';
            char level_desc[256];
            StackToolFormatLevelInfo(tool, stack_n, false, level_desc, IM_ARRAYSIZE(level_desc));
            for (int n = 0; level_desc[n] && p + 2 < p_end; n++)
            {
                if (level_desc[n] == '/')
                    *p++ = '\\';
                *p++ = level_desc[n];
            }
        }
        *p = '\0';
        SetClipboardText(g.TempBuffer.Data);
    }

    // Display decorated stack
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);
            TableNextColumn();
            StackToolFormatLevelInfo(tool, n, true, g.TempBuffer.Data, g.TempBuffer.Size);
            TextUnformatted(g.TempBuffer.Data);
            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}